

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

string_t duckdb::UncompressedStringStorage::ReadString
                   (data_ptr_t target,int32_t offset,uint32_t string_length)

{
  data_ptr_t __src;
  string_t sVar1;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 local_c;
  
  __src = target + offset;
  if (string_length < 0xd) {
    local_c = 0;
    uStack_14 = 0;
    uStack_10 = 0;
    if (string_length == 0) {
      __src = (data_ptr_t)0x0;
    }
    else {
      switchD_00916250::default(&uStack_14,__src,(ulong)string_length);
      __src = (data_ptr_t)CONCAT44(local_c,uStack_10);
    }
  }
  else {
    uStack_14 = *(undefined4 *)__src;
  }
  sVar1.value._4_1_ = (undefined1)uStack_14;
  sVar1.value._5_1_ = uStack_14._1_1_;
  sVar1.value._6_1_ = uStack_14._2_1_;
  sVar1.value._7_1_ = uStack_14._3_1_;
  sVar1.value.pointer.length = string_length;
  sVar1.value.pointer.ptr = (char *)__src;
  return (string_t)sVar1.value;
}

Assistant:

string_t UncompressedStringStorage::ReadString(data_ptr_t target, int32_t offset, uint32_t string_length) {
	auto ptr = target + offset;
	auto str_ptr = char_ptr_cast(ptr);
	return string_t(str_ptr, string_length);
}